

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

ZSTD_compressionParameters *
ZSTD_adjustCParams(ZSTD_compressionParameters *__return_storage_ptr__,
                  ZSTD_compressionParameters cPar,unsigned_long_long srcSize,size_t dictSize)

{
  ZSTD_compressionParameters cPar_00;
  ZSTD_strategy ZVar1;
  ZSTD_strategy ZVar2;
  uint uVar3;
  uint uVar6;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  ZVar2 = ZSTD_btultra2;
  if (cPar.strategy < ZSTD_btultra2) {
    ZVar2 = cPar.strategy;
  }
  ZVar1 = ZSTD_fast;
  if (0 < (int)cPar.strategy) {
    ZVar1 = ZVar2;
  }
  auVar7 = pmovsxbd(in_XMM2,0x106060a);
  auVar4._0_4_ = -(uint)((int)cPar.windowLog < auVar7._0_4_);
  auVar4._4_4_ = -(uint)((int)cPar.chainLog < auVar7._4_4_);
  auVar4._8_4_ = -(uint)((int)cPar.hashLog < auVar7._8_4_);
  auVar4._12_4_ = -(uint)((int)cPar.searchLog < auVar7._12_4_);
  auVar8._0_4_ = (uint)(0x1f < cPar.windowLog) * 0x1f | (0x1f >= cPar.windowLog) * cPar.windowLog;
  auVar8._4_4_ = (uint)(0x1e < cPar.chainLog) * 0x1e | (0x1e >= cPar.chainLog) * cPar.chainLog;
  auVar8._8_4_ = (uint)(0x1e < cPar.hashLog) * 0x1e | (0x1e >= cPar.hashLog) * cPar.hashLog;
  auVar8._12_4_ = (uint)(0x1e < cPar.searchLog) * 0x1e | (0x1e >= cPar.searchLog) * cPar.searchLog;
  auVar4 = blendvps(auVar8,auVar7,auVar4);
  auVar8 = pmovsxbq(auVar7,3);
  uVar3 = cPar.minMatch;
  auVar7._0_4_ = -(uint)((int)uVar3 < auVar8._0_4_);
  uVar6 = cPar.targetLength;
  auVar7._4_4_ = -(uint)((int)uVar6 < auVar8._4_4_);
  auVar7._8_4_ = -(uint)(0 < auVar8._8_4_);
  auVar7._12_4_ = -(uint)(0 < auVar8._12_4_);
  auVar5._0_4_ = (uint)(7 < uVar3) * 7 | (7 >= uVar3) * uVar3;
  auVar5._4_4_ = (uint)(0x20000 < uVar6) * 0x20000 | (0x20000 >= uVar6) * uVar6;
  auVar5._8_8_ = 0;
  auVar7 = blendvps(auVar5,auVar8,auVar7);
  cPar.minMatch = auVar7._0_4_;
  cPar.targetLength = auVar7._4_4_;
  cPar_00.strategy = ZVar1;
  cPar_00.targetLength = cPar.targetLength;
  cPar_00.minMatch = cPar.minMatch;
  cPar_00.windowLog = auVar4._0_4_;
  cPar_00.chainLog = auVar4._4_4_;
  cPar_00.hashLog = auVar4._8_4_;
  cPar_00.searchLog = auVar4._12_4_;
  ZSTD_adjustCParams_internal
            (__return_storage_ptr__,cPar_00,srcSize | -(ulong)(srcSize == 0),dictSize,
             ZSTD_cpm_unknown,ZSTD_ps_auto);
  return __return_storage_ptr__;
}

Assistant:

static ZSTD_compressionParameters
ZSTD_clampCParams(ZSTD_compressionParameters cParams)
{
#   define CLAMP_TYPE(cParam, val, type) {                                \
        ZSTD_bounds const bounds = ZSTD_cParam_getBounds(cParam);         \
        if ((int)val<bounds.lowerBound) val=(type)bounds.lowerBound;      \
        else if ((int)val>bounds.upperBound) val=(type)bounds.upperBound; \
    }
#   define CLAMP(cParam, val) CLAMP_TYPE(cParam, val, unsigned)
    CLAMP(ZSTD_c_windowLog, cParams.windowLog);
    CLAMP(ZSTD_c_chainLog,  cParams.chainLog);
    CLAMP(ZSTD_c_hashLog,   cParams.hashLog);
    CLAMP(ZSTD_c_searchLog, cParams.searchLog);
    CLAMP(ZSTD_c_minMatch,  cParams.minMatch);
    CLAMP(ZSTD_c_targetLength,cParams.targetLength);
    CLAMP_TYPE(ZSTD_c_strategy,cParams.strategy, ZSTD_strategy);
    return cParams;
}